

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O1

void __thiscall read_wm_slot::operator()(read_wm_slot *this,wm_slot **_slot,xr_reader *r)

{
  uint *puVar1;
  wm_slot *value;
  ulong __n;
  read_wm_data local_59;
  undefined1 local_58 [16];
  pointer local_48;
  pointer pwStack_40;
  pointer local_38;
  
  value = (wm_slot *)operator_new(0x58);
  (value->shader)._M_dataplus._M_p = (pointer)&(value->shader).field_2;
  (value->shader)._M_string_length = 0;
  (value->shader).field_2._M_local_buf[0] = '\0';
  (value->texture)._M_dataplus._M_p = (pointer)&(value->texture).field_2;
  (value->texture)._M_string_length = 0;
  (value->texture).field_2._M_local_buf[0] = '\0';
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_slot = value;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  __n = (ulong)*puVar1;
  xray_re::xr_reader::r_sz(r,(string *)value);
  xray_re::xr_reader::r_sz(r,&value->texture);
  std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::reserve(&value->wallmarks,__n);
  if (__n != 0) {
    do {
      local_48 = (pointer)0x0;
      pwStack_40 = (pointer)0x0;
      local_58._0_8_ = 0;
      local_58._8_8_ = 0;
      local_38 = (pointer)0x0;
      std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::
      emplace_back<xray_re::wm_data>(&value->wallmarks,(wm_data *)local_58);
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      __n = __n - 1;
      read_wm_data::operator()
                (&local_59,
                 (value->wallmarks).
                 super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1,r);
    } while (__n != 0);
  }
  return;
}

Assistant:

void operator()(wm_slot*& _slot, xr_reader& r) const {
	wm_slot* slot = new wm_slot;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wm_data());
}